

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_8_variance4x4_c(uint8_t *a,int a_stride,uint8_t *b,int b_stride,uint32_t *sse)

{
  uint32_t uVar1;
  long lVar2;
  int j;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  lVar2 = (long)b * 2;
  lVar4 = (long)a * 2;
  iVar5 = 0;
  uVar1 = 0;
  iVar6 = 0;
  do {
    lVar3 = 0;
    iVar7 = 0;
    do {
      iVar8 = (uint)*(ushort *)(lVar4 + lVar3 * 2) - (uint)*(ushort *)(lVar2 + lVar3 * 2);
      iVar7 = iVar7 + iVar8;
      uVar1 = uVar1 + iVar8 * iVar8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    iVar6 = iVar6 + iVar7;
    iVar5 = iVar5 + 1;
    lVar2 = lVar2 + (long)b_stride * 2;
    lVar4 = lVar4 + (long)a_stride * 2;
  } while (iVar5 != 4);
  *sse = uVar1;
  return uVar1 - (int)((ulong)((long)iVar6 * (long)iVar6) >> 4);
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}